

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::SGXMLScanner::anyAttributeValidation
          (SGXMLScanner *this,SchemaAttDef *attWildCard,uint uriId,bool *skipThisOne,
          bool *laxThisOne)

{
  AttTypes AVar1;
  DefAttTypes DVar2;
  ValueVectorOf<unsigned_int> *this_00;
  uint *puVar3;
  XMLSize_t i;
  XMLSize_t getAt;
  bool bVar4;
  XMLSize_t XVar5;
  
  AVar1 = (attWildCard->super_XMLAttDef).fType;
  *skipThisOne = false;
  *laxThisOne = false;
  if (AVar1 == Any_Any) {
    bVar4 = true;
  }
  else {
    if (AVar1 == Any_List) {
      this_00 = attWildCard->fNamespaceList;
      if (this_00 == (ValueVectorOf<unsigned_int> *)0x0) {
        XVar5 = 0;
      }
      else {
        XVar5 = this_00->fCurCount;
      }
      if (XVar5 != 0) {
        bVar4 = false;
        getAt = 0;
        do {
          puVar3 = ValueVectorOf<unsigned_int>::elementAt(this_00,getAt);
          if (*puVar3 == uriId) {
            bVar4 = true;
          }
          getAt = getAt + 1;
        } while (XVar5 != getAt);
        goto LAB_002bc0fc;
      }
    }
    else if (AVar1 == Any_Other) {
      bVar4 = (this->super_XMLScanner).fEmptyNamespaceId != uriId &&
              attWildCard->fAttName->fURIId != uriId;
      goto LAB_002bc0fc;
    }
    bVar4 = false;
  }
LAB_002bc0fc:
  if ((bVar4) &&
     ((DVar2 = (attWildCard->super_XMLAttDef).fDefaultType, DVar2 == ProcessContents_Skip ||
      (skipThisOne = laxThisOne, DVar2 == ProcessContents_Lax)))) {
    *skipThisOne = true;
  }
  return bVar4;
}

Assistant:

bool SGXMLScanner::anyAttributeValidation(SchemaAttDef* attWildCard, unsigned int uriId, bool& skipThisOne, bool& laxThisOne)
{
    XMLAttDef::AttTypes wildCardType = attWildCard->getType();
    bool anyEncountered = false;
    skipThisOne = false;
    laxThisOne = false;
    if (wildCardType == XMLAttDef::Any_Any)
        anyEncountered = true;
    else if (wildCardType == XMLAttDef::Any_Other) {
        if (attWildCard->getAttName()->getURI() != uriId
            && uriId != fEmptyNamespaceId)
            anyEncountered = true;
    }
    else if (wildCardType == XMLAttDef::Any_List) {
        ValueVectorOf<unsigned int>* nameURIList = attWildCard->getNamespaceList();
        XMLSize_t listSize = (nameURIList) ? nameURIList->size() : 0;

        if (listSize) {
            for (XMLSize_t i=0; i < listSize; i++) {
                if (nameURIList->elementAt(i) == uriId)
                    anyEncountered = true;
            }
        }
    }

    if (anyEncountered) {
        XMLAttDef::DefAttTypes   defType   = attWildCard->getDefaultType();
        if (defType == XMLAttDef::ProcessContents_Skip) {
            // attribute should just be bypassed,
            skipThisOne = true;
            if (getPSVIHandler())
            {
                // REVISIT:
                // PSVIAttribute->setValidationAttempted(PSVIItem::VALIDATION_NONE);
            }
        }
        else if (defType == XMLAttDef::ProcessContents_Lax) {
            laxThisOne = true;
        }
    }

    return anyEncountered;
}